

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTest.h
# Opt level: O0

unique_ptr<BaseTest,_std::default_delete<BaseTest>_>
TestFactory::createTest<(TestFactory::Type)1,int>(int args)

{
  pointer pBVar1;
  BaseTest *in_RDI;
  unique_ptr<BaseTest,_std::default_delete<BaseTest>_> *ret;
  unique_ptr<BaseTest,_std::default_delete<BaseTest>_> *in_stack_ffffffffffffffc0;
  unique_ptr<DistinctIntTest,_std::default_delete<DistinctIntTest>_> *this;
  _Head_base<0UL,_BaseTest_*,_false> this_00;
  int *in_stack_ffffffffffffffd8;
  unique_ptr<DistinctIntTest,_std::default_delete<DistinctIntTest>_> local_18;
  undefined1 local_d;
  
  local_d = 0;
  this_00._M_head_impl = in_RDI;
  std::unique_ptr<BaseTest,std::default_delete<BaseTest>>::
  unique_ptr<std::default_delete<BaseTest>,void>(in_stack_ffffffffffffffc0);
  std::make_unique<DistinctIntTest,int>(in_stack_ffffffffffffffd8);
  this = &local_18;
  std::unique_ptr<BaseTest,std::default_delete<BaseTest>>::operator=
            ((unique_ptr<BaseTest,_std::default_delete<BaseTest>_> *)this_00._M_head_impl,
             (unique_ptr<DistinctIntTest,_std::default_delete<DistinctIntTest>_> *)in_RDI);
  std::unique_ptr<DistinctIntTest,_std::default_delete<DistinctIntTest>_>::~unique_ptr(this);
  pBVar1 = std::unique_ptr<BaseTest,_std::default_delete<BaseTest>_>::operator->
                     ((unique_ptr<BaseTest,_std::default_delete<BaseTest>_> *)0x102c3d);
  (**pBVar1->_vptr_BaseTest)();
  return (__uniq_ptr_data<BaseTest,_std::default_delete<BaseTest>,_true,_true>)
         (tuple<BaseTest_*,_std::default_delete<BaseTest>_>)this_00._M_head_impl;
}

Assistant:

static std::unique_ptr<BaseTest>
	createTest(Args... args)
	{
		std::unique_ptr<BaseTest> ret;
		if constexpr (T == RandomDouble)
			ret = std::make_unique<RandomDoubleTest>(std::forward<Args>(args)...);
		else if constexpr (T == DistinctInt)
			ret = std::make_unique<DistinctIntTest>(std::forward<Args>(args)...);
		else if constexpr (T == Generator)
			ret = std::make_unique<GeneratorTest>(std::forward<Args>(args)...);
		ret->generate();
		return ret;
	}